

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool logValueDistribution
               (HighsLogOptions *log_options,HighsValueDistribution *value_distribution,HighsInt mu)

{
  HighsLogOptions *pHVar1;
  bool bVar2;
  const_reference pvVar3;
  undefined8 uVar4;
  uint *puVar5;
  const_reference pvVar6;
  uint in_EDX;
  long in_RSI;
  HighsLogOptions *in_RDI;
  double dVar7;
  double dVar8;
  HighsInt i_1;
  HighsInt count;
  HighsInt int_percentage;
  double percentage;
  HighsInt sum_report_count;
  HighsInt i;
  double min_value;
  HighsInt sum_count;
  bool not_reported_ones;
  string value_name;
  HighsInt num_count;
  char *in_stack_fffffffffffffe88;
  HighsLogOptions *pHVar9;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint uVar10;
  int local_7c;
  uint local_68;
  int local_54;
  uint local_48;
  string local_40 [32];
  int local_20;
  uint local_1c;
  long local_18;
  HighsLogOptions *local_10;
  byte local_1;
  
  if (*(int *)(in_RSI + 0x90) < 1) {
    local_1 = 0;
  }
  else {
    local_20 = *(int *)(in_RSI + 0x40);
    if (local_20 < 0) {
      local_1 = 0;
    }
    else {
      local_1c = in_EDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              in_stack_fffffffffffffe88);
      pHVar9 = local_10;
      if (bVar2) {
        uVar4 = std::__cxx11::string::c_str();
        highsLogDev(pHVar9,kInfo,"\n%s\n",uVar4);
      }
      std::__cxx11::string::string(local_40,(string *)(local_18 + 0x20));
      bVar2 = true;
      local_48 = *(int *)(local_18 + 0x44) + *(int *)(local_18 + 0x48);
      pHVar9 = *(HighsLogOptions **)(local_18 + 0x50);
      for (local_54 = 0; local_54 < local_20 + 1; local_54 = local_54 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0x78),(long)local_54);
        local_48 = *pvVar3 + local_48;
      }
      if (local_48 == 0) {
        local_1 = 0;
      }
      else {
        highsLogDev(pHVar9,(HighsLogType)local_10,(char *)0x1,"Min value = %g\n");
        pHVar1 = local_10;
        uVar4 = std::__cxx11::string::c_str();
        highsLogDev(pHVar9,(HighsLogType)pHVar1,(char *)0x1,"     Minimum %svalue is %10.4g",uVar4);
        if ((int)local_1c < 1) {
          highsLogDev(local_10,kInfo,"\n");
        }
        else {
          highsLogDev(local_10,kInfo,"  corresponding to  %10d / %10d\n",
                      (ulong)(uint)(int)((double)pHVar9 * (double)(int)local_1c));
        }
        pHVar9 = local_10;
        uVar4 = std::__cxx11::string::c_str();
        highsLogDev(*(HighsLogOptions **)(local_18 + 0x58),(HighsLogType)pHVar9,(char *)0x1,
                    "     Maximum %svalue is %10.4g",uVar4);
        if ((int)local_1c < 1) {
          highsLogDev(local_10,kInfo,"\n");
        }
        else {
          highsLogDev(local_10,kInfo,"  corresponding to  %10d / %10d\n",
                      (ulong)(uint)(int)(*(double *)(local_18 + 0x58) * (double)(int)local_1c));
        }
        local_68 = 0;
        uVar10 = *(uint *)(local_18 + 0x44);
        if (uVar10 != 0) {
          dVar7 = doublePercentage(uVar10,local_48);
          pHVar9 = local_10;
          uVar4 = std::__cxx11::string::c_str();
          highsLogDev((HighsLogOptions *)0x0,(HighsLogType)pHVar9,(char *)0x1,
                      "%12d %svalues (%3d%%) are %10.4g\n",(ulong)uVar10,uVar4,
                      (ulong)(uint)(int)dVar7);
          local_68 = uVar10;
        }
        puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(local_18 + 0x78),0);
        uVar10 = *puVar5;
        if (uVar10 != 0) {
          dVar7 = doublePercentage(uVar10,local_48);
          pHVar9 = local_10;
          uVar4 = std::__cxx11::string::c_str();
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),0);
          highsLogDev((HighsLogOptions *)0x0,(HighsLogType)*pvVar6,(char *)pHVar9,1,
                      "%12d %svalues (%3d%%) in (%10.4g, %10.4g)",(ulong)uVar10,uVar4,
                      (ulong)(uint)(int)dVar7);
          pHVar9 = local_10;
          local_68 = uVar10 + local_68;
          if ((int)local_1c < 1) {
            highsLogDev(local_10,kInfo,"\n");
          }
          else {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),0);
            highsLogDev(pHVar9,kInfo," corresponding to (%10d, %10d)\n",0,
                        (ulong)(uint)(int)(*pvVar6 * (double)(int)local_1c));
          }
        }
        for (local_7c = 1; local_7c < local_20; local_7c = local_7c + 1) {
          if ((bVar2) &&
             (pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                                  (long)(local_7c + -1)), 1.0 <= *pvVar6)) {
            uVar10 = *(uint *)(local_18 + 0x48);
            if (uVar10 != 0) {
              dVar7 = doublePercentage(uVar10,local_48);
              pHVar9 = local_10;
              uVar4 = std::__cxx11::string::c_str();
              highsLogDev((HighsLogOptions *)0x3ff0000000000000,(HighsLogType)pHVar9,(char *)0x1,
                          "%12d %svalues (%3d%%) are             %10.4g",(ulong)uVar10,uVar4,
                          (ulong)(uint)(int)dVar7);
              local_68 = uVar10 + local_68;
              if ((int)local_1c < 1) {
                highsLogDev(local_10,kInfo,"\n");
              }
              else {
                highsLogDev(local_10,kInfo," corresponding to %10d\n",(ulong)local_1c);
              }
            }
            bVar2 = false;
          }
          puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)(local_18 + 0x78),
                                      (long)local_7c);
          uVar10 = *puVar5;
          if (uVar10 != 0) {
            dVar7 = doublePercentage(uVar10,local_48);
            pHVar1 = local_10;
            uVar4 = std::__cxx11::string::c_str();
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                                (long)(local_7c + -1));
            pHVar9 = (HighsLogOptions *)*pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                                (long)local_7c);
            highsLogDev(pHVar9,(HighsLogType)*pvVar6,(char *)pHVar1,1,
                        "%12d %svalues (%3d%%) in [%10.4g, %10.4g)",(ulong)uVar10,uVar4,
                        (ulong)(uint)(int)dVar7);
            pHVar9 = local_10;
            local_68 = uVar10 + local_68;
            if ((int)local_1c < 1) {
              highsLogDev(local_10,kInfo,"\n");
            }
            else {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                                  (long)(local_7c + -1));
              dVar7 = *pvVar6;
              dVar8 = (double)(int)local_1c;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                                  (long)local_7c);
              highsLogDev(pHVar9,kInfo," corresponding to [%10d, %10d)\n",
                          (ulong)(uint)(int)(dVar7 * dVar8),
                          (ulong)(uint)(int)(*pvVar6 * (double)(int)local_1c));
            }
          }
        }
        if ((bVar2) &&
           (pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                                (long)(local_20 + -1)), 1.0 <= *pvVar6)) {
          uVar10 = *(uint *)(local_18 + 0x48);
          if (uVar10 != 0) {
            dVar7 = doublePercentage(uVar10,local_48);
            pHVar9 = local_10;
            uVar4 = std::__cxx11::string::c_str();
            highsLogDev((HighsLogOptions *)0x3ff0000000000000,(HighsLogType)pHVar9,(char *)0x1,
                        "%12d %svalues (%3d%%) are             %10.4g",(ulong)uVar10,uVar4,
                        (ulong)(uint)(int)dVar7);
            local_68 = uVar10 + local_68;
            if ((int)local_1c < 1) {
              highsLogDev(local_10,kInfo,"\n");
            }
            else {
              highsLogDev(local_10,kInfo,"  corresponding to  %10d\n",(ulong)local_1c);
            }
          }
          bVar2 = false;
        }
        puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(local_18 + 0x78),
                                    (long)local_20);
        uVar10 = *puVar5;
        if (uVar10 != 0) {
          dVar7 = doublePercentage(uVar10,local_48);
          pHVar9 = local_10;
          uVar4 = std::__cxx11::string::c_str();
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                              (long)(local_20 + -1));
          highsLogDev((HighsLogOptions *)*pvVar6,(HighsLogType)pHVar9,(char *)0x1,
                      "%12d %svalues (%3d%%) in [%10.4g,        inf)",(ulong)uVar10,uVar4,
                      (ulong)(uint)(int)dVar7);
          pHVar9 = local_10;
          local_68 = uVar10 + local_68;
          if ((int)local_1c < 1) {
            highsLogDev(local_10,kInfo,"\n");
          }
          else {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                                (long)(local_20 + -1));
            highsLogDev(pHVar9,kInfo," corresponding to [%10d,        inf)\n",
                        (ulong)(uint)(int)(*pvVar6 * (double)(int)local_1c));
          }
        }
        if ((bVar2) && (uVar10 = *(uint *)(local_18 + 0x48), uVar10 != 0)) {
          dVar7 = doublePercentage(uVar10,local_48);
          pHVar9 = local_10;
          uVar4 = std::__cxx11::string::c_str();
          highsLogDev((HighsLogOptions *)0x3ff0000000000000,(HighsLogType)pHVar9,(char *)0x1,
                      "%12d %svalues (%3d%%) are             %10.4g",(ulong)uVar10,uVar4,
                      (ulong)(uint)(int)dVar7);
          local_68 = uVar10 + local_68;
          if ((int)local_1c < 1) {
            highsLogDev(local_10,kInfo,"\n");
          }
          else {
            highsLogDev(local_10,kInfo,"  corresponding to  %10d\n",(ulong)local_1c);
          }
        }
        pHVar9 = local_10;
        uVar10 = local_48;
        uVar4 = std::__cxx11::string::c_str();
        highsLogDev(pHVar9,kInfo,"%12d %svalues\n",(ulong)uVar10,uVar4);
        if (local_68 != local_48) {
          highsLogDev(local_10,kInfo,"ERROR: %d = sum_report_count != sum_count = %d\n",
                      (ulong)local_68,(ulong)local_48);
        }
        local_1 = 1;
      }
      std::__cxx11::string::~string(local_40);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool logValueDistribution(const HighsLogOptions& log_options,
                          const HighsValueDistribution& value_distribution,
                          const HighsInt mu) {
  if (value_distribution.sum_count_ <= 0) return false;
  const HighsInt num_count = value_distribution.num_count_;
  if (num_count < 0) return false;
  if (value_distribution.distribution_name_ != "")
    highsLogDev(log_options, HighsLogType::kInfo, "\n%s\n",
                value_distribution.distribution_name_.c_str());
  std::string value_name = value_distribution.value_name_;
  bool not_reported_ones = true;
  HighsInt sum_count =
      value_distribution.num_zero_ + value_distribution.num_one_;
  const double min_value = value_distribution.min_value_;
  for (HighsInt i = 0; i < num_count + 1; i++)
    sum_count += value_distribution.count_[i];
  if (!sum_count) return false;
  highsLogDev(log_options, HighsLogType::kInfo, "Min value = %g\n", min_value);
  highsLogDev(log_options, HighsLogType::kInfo,
              "     Minimum %svalue is %10.4g", value_name.c_str(), min_value);
  if (mu > 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "  corresponding to  %10" HIGHSINT_FORMAT
                " / %10" HIGHSINT_FORMAT "\n",
                (HighsInt)(min_value * mu), mu);
  } else {
    highsLogDev(log_options, HighsLogType::kInfo, "\n");
  }
  highsLogDev(log_options, HighsLogType::kInfo,
              "     Maximum %svalue is %10.4g", value_name.c_str(),
              value_distribution.max_value_);
  if (mu > 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "  corresponding to  %10" HIGHSINT_FORMAT
                " / %10" HIGHSINT_FORMAT "\n",
                (HighsInt)(value_distribution.max_value_ * mu), mu);
  } else {
    highsLogDev(log_options, HighsLogType::kInfo, "\n");
  }
  HighsInt sum_report_count = 0;
  double percentage;
  HighsInt int_percentage;
  HighsInt count = value_distribution.num_zero_;
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) are %10.4g\n",
                count, value_name.c_str(), int_percentage, 0.0);
    sum_report_count += count;
  }
  count = value_distribution.count_[0];
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) in (%10.4g, %10.4g)",
                count, value_name.c_str(), int_percentage, 0.0,
                value_distribution.limit_[0]);
    sum_report_count += count;
    if (mu > 0) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  " corresponding to (%10" HIGHSINT_FORMAT
                  ", %10" HIGHSINT_FORMAT ")\n",
                  0, (HighsInt)(value_distribution.limit_[0] * mu));
    } else {
      highsLogDev(log_options, HighsLogType::kInfo, "\n");
    }
  }
  for (HighsInt i = 1; i < num_count; i++) {
    if (not_reported_ones && value_distribution.limit_[i - 1] >= 1.0) {
      count = value_distribution.num_one_;
      if (count) {
        percentage = doublePercentage(count, sum_count);
        int_percentage = percentage;
        highsLogDev(log_options, HighsLogType::kInfo,
                    "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                    "%%) are             %10.4g",
                    count, value_name.c_str(), int_percentage, 1.0);
        sum_report_count += count;
        if (mu > 0) {
          highsLogDev(log_options, HighsLogType::kInfo,
                      " corresponding to %10" HIGHSINT_FORMAT "\n", mu);
        } else {
          highsLogDev(log_options, HighsLogType::kInfo, "\n");
        }
      }
      not_reported_ones = false;
    }
    count = value_distribution.count_[i];
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) in [%10.4g, %10.4g)",
                  count, value_name.c_str(), int_percentage,
                  value_distribution.limit_[i - 1],
                  value_distribution.limit_[i]);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    " corresponding to [%10" HIGHSINT_FORMAT
                    ", %10" HIGHSINT_FORMAT ")\n",
                    (HighsInt)(value_distribution.limit_[i - 1] * mu),
                    (HighsInt)(value_distribution.limit_[i] * mu));
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
  }
  if (not_reported_ones && value_distribution.limit_[num_count - 1] >= 1.0) {
    count = value_distribution.num_one_;
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) are             %10.4g",
                  count, value_name.c_str(), int_percentage, 1.0);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    "  corresponding to  %10" HIGHSINT_FORMAT "\n", mu);
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
    not_reported_ones = false;
  }
  count = value_distribution.count_[num_count];
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) in [%10.4g,        inf)",
                count, value_name.c_str(), int_percentage,
                value_distribution.limit_[num_count - 1]);
    sum_report_count += count;
    if (mu > 0) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  " corresponding to [%10" HIGHSINT_FORMAT ",        inf)\n",
                  (HighsInt)(value_distribution.limit_[num_count - 1] * mu));
    } else {
      highsLogDev(log_options, HighsLogType::kInfo, "\n");
    }
  }
  if (not_reported_ones) {
    count = value_distribution.num_one_;
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) are             %10.4g",
                  count, value_name.c_str(), int_percentage, 1.0);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    "  corresponding to  %10" HIGHSINT_FORMAT "\n", mu);
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
  }
  highsLogDev(log_options, HighsLogType::kInfo,
              "%12" HIGHSINT_FORMAT " %svalues\n", sum_count,
              value_name.c_str());
  if (sum_report_count != sum_count)
    highsLogDev(log_options, HighsLogType::kInfo,
                "ERROR: %" HIGHSINT_FORMAT
                " = sum_report_count != sum_count = %" HIGHSINT_FORMAT "\n",
                sum_report_count, sum_count);
  return true;
}